

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_cure_blindness(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_R8D;
  __type_conflict2 _Var2;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe0;
  
  bVar1 = is_affected(in_RCX,(int)gsn_blindness);
  if (((!bVar1) && (bVar1 = is_affected(in_RCX,(int)gsn_blindness_dust), !bVar1)) &&
     (bVar1 = is_affected(in_RCX,(int)gsn_blinding_orb), !bVar1)) {
    if (in_RCX == in_RDX) {
      send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
      return;
    }
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffc8,0);
    return;
  }
  bVar1 = is_affected(in_RCX,(int)gsn_blindness_dust);
  if ((bVar1) &&
     (bVar1 = check_dispel(in_stack_ffffffffffffffe0,in_RCX,
                           (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20)), bVar1)) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffc8,0);
    bVar1 = is_affected(in_RCX,(int)gsn_blindness);
    if (!bVar1) {
      return;
    }
  }
  bVar1 = check_dispel(in_stack_ffffffffffffffe0,in_RCX,
                       (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (bVar1) {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffc8,0);
  }
  else {
    bVar1 = is_affected(in_RCX,(int)gsn_blindness);
    if (bVar1) {
      bVar1 = is_npc(in_stack_ffffffffffffffc8);
      if (bVar1) {
        in_stack_ffffffffffffffd0 = (void *)in_RDX->act[0];
        _Var2 = std::pow<int,int>(0,0x61446e);
        if (((ulong)in_stack_ffffffffffffffd0 & (long)_Var2) != 0) {
          affect_strip((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_RCX >> 0x20));
          send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
          goto LAB_006144bd;
        }
      }
      send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
    }
  }
LAB_006144bd:
  bVar1 = check_dispel(in_stack_ffffffffffffffe0,in_RCX,
                       (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (bVar1) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffc8,0);
  }
  else {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  }
  return;
}

Assistant:

void spell_cure_blindness(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (!is_affected(victim, gsn_blindness)
		&& !is_affected(victim, gsn_blindness_dust)
		&& !is_affected(victim, gsn_blinding_orb))
	{
		if (victim == ch)
			send_to_char("You aren't blind.\n\r", ch);
		else
			act("$N doesn't appear to be blinded.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	if (is_affected(victim, gsn_blindness_dust))
	{
		if (check_dispel(level, victim, gsn_blindness_dust))
		{
			act("The dust in $n's eyes fades away.", victim, 0, 0, TO_ROOM);

			if (!is_affected(victim, gsn_blindness))
				return;
		}
	}

	if (check_dispel(level, victim, gsn_blindness))
	{
		send_to_char("Your vision returns!\n\r", victim);
		act("$n is no longer blinded.", victim, nullptr, nullptr, TO_ROOM);
	}
	else if (is_affected(victim, gsn_blindness))
	{
		if (is_npc(ch) && IS_SET(ch->act, ACT_IS_HEALER))
		{
			affect_strip(victim, gsn_blindness);
			send_to_char("Your vision returns!\n\r", victim);
		}
		else
		{
			send_to_char("Spell failed.\n\r", ch);
		}
	}

	if (check_dispel(level, victim, gsn_blinding_orb))
	{
		act("$n is no longer blinded.", victim, nullptr, nullptr, TO_ROOM);
	}
	else
	{
		send_to_char("Spell failed.\n\r", ch);
	}
}